

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerResults.cpp
# Opt level: O1

void __thiscall
AsyncRgbLedAnalyzerResults::GenerateExportFile
          (AsyncRgbLedAnalyzerResults *this,char *file,DisplayBase display_base,
          U32 export_type_user_id)

{
  U8 bitSize;
  char cVar1;
  ulonglong uVar2;
  size_t sVar3;
  ostream *poVar4;
  ulonglong uVar5;
  U8 webColor [3];
  RGBValue rgb;
  char webBuf [8];
  Frame frame;
  char gs [16];
  char rs [16];
  char bs [16];
  ofstream file_stream;
  char time_str [128];
  byte local_333;
  byte local_332;
  byte local_331;
  DisplayBase local_330;
  uint local_32c;
  RGBValue local_328;
  ulonglong local_320;
  char local_318 [8];
  ulonglong local_310 [2];
  U64 local_300;
  char local_2e8 [16];
  char local_2d8 [16];
  char local_2c8 [16];
  long local_2b8;
  filebuf local_2b0 [240];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_330 = display_base;
  std::ofstream::ofstream(&local_2b8,file,_S_out);
  local_320 = Analyzer::GetTriggerSample();
  local_32c = Analyzer::GetSampleRate();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"Time [s], Packet ID, LED Index, Red, Green, Blue, Web-CSS",0x39)
  ;
  std::ios::widen((char)(ostream *)&local_2b8 + (char)*(undefined8 *)(local_2b8 + -0x18));
  std::ostream::put((char)&local_2b8);
  std::ostream::flush();
  uVar2 = AnalyzerResults::GetNumFrames();
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      AnalyzerResults::GetFrame((ulonglong)local_310);
      AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
      AnalyzerHelpers::GetTimeString(local_310[0],local_320,local_32c,local_b8,0x80);
      local_328 = RGBValue::CreateFromU64(local_300);
      GenerateRGBStrings(this,&local_328,local_330,0x10,local_2d8,local_2e8,local_2c8);
      bitSize = AsyncRgbLedAnalyzerSettings::BitSize(this->mSettings);
      RGBValue::ConvertTo8Bit(&local_328,bitSize,&local_333);
      snprintf(local_318,8,"#%02x%02x%02x",(ulong)local_333,(ulong)local_332,(ulong)local_331);
      sVar3 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,local_b8,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,",",1);
      poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      sVar3 = strlen(local_2d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2d8,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      sVar3 = strlen(local_2e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2e8,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      sVar3 = strlen(local_2c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2c8,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      sVar3 = strlen(local_318);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_318,sVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      cVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar5);
      if (cVar1 == '\0') {
        Frame::~Frame((Frame *)local_310);
      }
      else {
        std::ofstream::close();
        Frame::~Frame((Frame *)local_310);
        if (cVar1 != '\0') goto LAB_00107e49;
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  std::ofstream::close();
LAB_00107e49:
  local_2b8 = _VTT;
  *(undefined8 *)(local_2b0 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_2b0);
  std::ios_base::~ios_base(local_1c0);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    file_stream << "Time [s], Packet ID, LED Index, Red, Green, Blue, Web-CSS" << std::endl;

    const U64 num_frames = GetNumFrames();

    for( U64 i = 0; i < num_frames; i++ )
    {
        const Frame frame = GetFrame( i );
        U64 packetId = GetPacketContainingFrameSequential( num_frames );

        if( packetId == INVALID_RESULT_INDEX )
        {
            packetId = -1;
        }

        char time_str[ 128 ];
        AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

        RGBValue rgb = RGBValue::CreateFromU64( frame.mData1 );

        // RGB numerical value representation
        const size_t bufSize = 16;
        char rs[ bufSize ], gs[ bufSize ], bs[ bufSize ];
        GenerateRGBStrings( rgb, display_base, bufSize, rs, gs, bs );

        // CSS representation
        U8 webColor[ 3 ];
        rgb.ConvertTo8Bit( mSettings->BitSize(), webColor );
        char webBuf[ 8 ];
        ::snprintf( webBuf, sizeof( webBuf ), "#%02x%02x%02x", webColor[ 0 ], webColor[ 1 ], webColor[ 2 ] );

        file_stream << time_str << "," << packetId << "," << frame.mData2 << "," << rs << "," << gs << "," << bs << "," << webBuf
                    << std::endl;

        if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
        {
            file_stream.close();
            return;
        }
    }

    file_stream.close();
}